

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_node.cc
# Opt level: O2

RC __thiscall QL_Node::PrintCondition(QL_Node *this,Condition condition)

{
  ostream *poVar1;
  size_t sVar2;
  void *__dest;
  char *pcVar3;
  RC RVar4;
  size_t __size;
  
  if (condition.lhsAttr.relName == (char *)0x0) {
    condition.lhsAttr.relName = "NULL";
  }
  std::operator<<((ostream *)&std::cout,condition.lhsAttr.relName);
  poVar1 = std::operator<<((ostream *)&std::cout,".");
  std::operator<<(poVar1,condition.lhsAttr.attrName);
  RVar4 = 0x195;
  if (condition.op - EQ_OP < 6) {
    std::operator<<((ostream *)&std::cout,
                    &DAT_00118668 + *(int *)(&DAT_00118668 + (ulong)(condition.op - EQ_OP) * 4));
    if (condition.bRhsIsAttr == 0) {
      if (condition.rhsValue.type != FLOAT) {
        if (condition.rhsValue.type == INT) {
          printf("%d ",(ulong)*condition.rhsValue.data);
          return 0;
        }
        sVar2 = strlen((char *)condition.rhsValue.data);
        __size = (size_t)((int)sVar2 + 1);
        __dest = malloc(__size);
        memcpy(__dest,condition.rhsValue.data,__size);
        *(undefined1 *)((long)__dest + (long)(int)sVar2) = 0;
        printf("%s ",__dest);
        free(__dest);
        return 0;
      }
      printf("%f ",(double)*condition.rhsValue.data);
    }
    else {
      pcVar3 = "NULL";
      if (condition.rhsAttr.relName != (char *)0x0) {
        pcVar3 = condition.rhsAttr.relName;
      }
      std::operator<<((ostream *)&std::cout,pcVar3);
      poVar1 = std::operator<<((ostream *)&std::cout,".");
      std::operator<<(poVar1,condition.rhsAttr.attrName);
    }
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

RC QL_Node::PrintCondition(const Condition condition){
  RC rc = 0;

  // Print the LHS attribute
  if(condition.lhsAttr.relName == NULL){
    cout << "NULL";
  }
  else
    cout << condition.lhsAttr.relName;
  cout << "." << condition.lhsAttr.attrName;

  // Print the operator
  switch(condition.op){
    case EQ_OP : cout << "="; break;
    case LT_OP : cout << "<"; break;
    case GT_OP : cout << ">"; break;
    case LE_OP : cout << "<="; break;
    case GE_OP : cout << ">="; break;
    case NE_OP : cout << "!="; break;
    default: return (QL_BADCOND);
  }
  // If the RHS is an attribute, print it
  if(condition.bRhsIsAttr){
    if(condition.rhsAttr.relName == NULL){
      cout << "NULL";
    }
    else
      cout << condition.rhsAttr.relName;
    cout << "." << condition.rhsAttr.attrName;
  }
  else{ // selects the correct printer format for this attribute
    if(condition.rhsValue.type == INT){
      print_int(condition.rhsValue.data, 4);
    }
    else if(condition.rhsValue.type == FLOAT){
      print_float(condition.rhsValue.data, 4);
    }
    else{
      print_string(condition.rhsValue.data, strlen((const char *)condition.rhsValue.data));
    }
  }

  return (0);
}